

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall
ktx::CommandCompare::compareLevelIndex(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  string_view jsonPathIn;
  string_view jsonPathIn_00;
  string_view jsonPathIn_01;
  string_view textHeaderIn;
  string_view textHeaderIn_00;
  string_view textHeaderIn_01;
  ulong uVar1;
  void *__buf;
  bool bVar2;
  reference pvVar3;
  uint *puVar4;
  size_type sVar5;
  reference pvVar6;
  array<ktx::InputStream,_2UL> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  ktxLevelIndexEntry *extraout_RDX_00;
  char *in_RSI;
  v10 *pvVar7;
  CommandCompare *in_RDI;
  undefined1 auVar8 [16];
  string_view fmt;
  ktxLevelIndexEntry entry;
  size_t i;
  optional<ktxLevelIndexEntry> levelIndexEntry [2];
  unsigned_long levelIndexEntryOffset;
  uint32_t level;
  uint32_t maxNumLevels;
  uint32_t numLevels [2];
  string *in_stack_fffffffffffff698;
  unsigned_long *puVar9;
  array<ktx::InputStream,_2UL> *in_stack_fffffffffffff6a0;
  ktxLevelIndexEntry *in_stack_fffffffffffff6a8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff6b0;
  string *in_stack_fffffffffffff6c8;
  allocator<char> *in_stack_fffffffffffff6d0;
  char *in_stack_fffffffffffff6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *in_stack_fffffffffffff6e8;
  char *in_stack_fffffffffffff6f0;
  string *in_stack_fffffffffffff700;
  void **local_888;
  DiffBase<unsigned_long> *in_stack_fffffffffffff798;
  PrintDiff *in_stack_fffffffffffff7a0;
  char *local_848;
  undefined8 local_840;
  string local_838 [32];
  undefined1 local_818 [16];
  v10 *local_808 [2];
  string local_7f8 [32];
  undefined1 local_7d8 [16];
  v10 local_7c8 [80];
  unsigned_long local_778 [4];
  char *local_758 [2];
  string local_748 [32];
  undefined1 local_728 [16];
  v10 *local_718 [2];
  string local_708 [16];
  format_args in_stack_fffffffffffff908;
  char *in_stack_fffffffffffff918;
  size_t in_stack_fffffffffffff920;
  v10 local_6d8 [80];
  unsigned_long local_688 [4];
  char *local_668 [2];
  string local_658 [32];
  undefined1 local_638 [16];
  v10 *local_628 [2];
  string local_618 [32];
  undefined1 local_5f8 [16];
  v10 local_5e8 [80];
  string *local_598;
  array<ktx::InputStream,_2UL> *local_590;
  v10 local_588 [24];
  ulong local_570;
  void *local_568 [8];
  void *local_528;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_51c;
  uint local_50c;
  uint local_508 [5];
  allocator<char> local_4f1;
  string local_4f0 [32];
  array<ktx::InputStream,_2UL> *local_4d0;
  char *local_4c8;
  basic_string_view<char,_std::char_traits<char>_> *local_4b8 [2];
  undefined8 local_4a8;
  basic_string_view<char,_std::char_traits<char>_> **local_4a0;
  char *local_498;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_488;
  char *local_480;
  undefined8 uStack_478;
  string *local_470;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_468 [2];
  undefined8 local_458;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_450;
  v10 *local_448;
  size_t local_440;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_438;
  v10 *local_430;
  size_t sStack_428;
  string *local_420;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_418 [2];
  undefined8 local_408;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_400;
  char *local_3f8;
  size_t local_3f0;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_3e8;
  char *local_3e0;
  size_t sStack_3d8;
  string *local_3d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_3c8 [2];
  undefined8 local_3b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_3b0;
  v10 *local_3a8;
  size_t local_3a0;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_398;
  v10 *local_390;
  size_t sStack_388;
  string *local_380;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_378 [2];
  undefined8 local_368;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_360;
  char *local_358;
  size_t local_350;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_348;
  char *local_340;
  size_t sStack_338;
  string *local_330;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_328 [3];
  undefined8 local_310;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_308;
  v10 *local_300;
  size_t local_2f8;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_2f0;
  v10 *local_2e8;
  size_t sStack_2e0;
  string *local_2d8;
  char *local_2d0;
  v10 **local_2c8;
  char *local_2c0;
  v10 **local_2b8;
  char *local_2b0;
  char **local_2a8;
  char *local_2a0;
  char **local_298;
  char *local_290;
  v10 **local_288;
  char *local_280;
  char **local_278;
  char *local_270;
  char **local_268;
  char *local_260;
  v10 **local_258;
  char *local_250;
  char **local_248;
  char *local_240;
  char **local_238;
  char *local_230;
  v10 **local_228;
  char *local_220;
  v10 **local_218;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_210;
  undefined8 *local_208;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_200;
  undefined8 local_1f8;
  undefined8 *local_1f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_1e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_1e0;
  undefined8 *local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_1d0;
  undefined8 local_1c8;
  undefined8 *local_1c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_1b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_1b0;
  undefined8 *local_1a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_1a0;
  undefined8 local_198;
  undefined8 *local_190;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_188;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_180;
  undefined8 *local_178;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_170;
  undefined8 local_168;
  undefined8 *local_160;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_158;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_150;
  undefined8 *local_148;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_140;
  undefined8 local_138;
  undefined8 *local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_128;
  basic_string_view<char,_std::char_traits<char>_> **local_120;
  undefined8 *local_118;
  basic_string_view<char,_std::char_traits<char>_> **local_110;
  undefined8 local_108;
  undefined8 *local_100;
  basic_string_view<char,_std::char_traits<char>_> **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  char **local_d0;
  char *local_c8;
  size_t sStack_c0;
  v10 **local_b0;
  v10 *local_a8;
  size_t sStack_a0;
  char **local_90;
  char *local_88;
  size_t sStack_80;
  v10 **local_70;
  v10 *local_68;
  size_t sStack_60;
  char **local_50;
  char *local_48;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  if ((in_RDI->options).super_OptionsCompare.ignoreIndex == none) {
    local_4d0 = in_RDX;
    local_4c8 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
    PrintDiff::setContext((PrintDiff *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
    std::__cxx11::string::~string(local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    local_51c.int128_value._12_4_ = 1;
    pvVar3 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[](&in_RDI->headers,0);
    puVar4 = std::max<unsigned_int>((uint *)((long)&local_51c.string.size + 4),&pvVar3->levelCount);
    local_50c = *puVar4;
    local_51c.int128_value._8_4_ = 1;
    pvVar3 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[](&in_RDI->headers,1);
    puVar4 = std::max<unsigned_int>((uint *)&local_51c.string.size,&pvVar3->levelCount);
    local_508[0] = *puVar4;
    pvVar7 = (v10 *)local_508;
    puVar4 = std::max<unsigned_int>(&local_50c,(uint *)pvVar7);
    fmt.size_ = in_stack_fffffffffffff920;
    fmt.data_ = in_stack_fffffffffffff918;
    local_51c.ulong_long_value._4_4_ = *puVar4;
    for (local_51c.int_value = 0; local_51c.uint_value < local_51c._4_4_;
        local_51c.int_value = local_51c.int_value + 1) {
      local_528 = (void *)((ulong)local_51c.uint_value * 0x18 + 0x50);
      local_888 = local_568;
      do {
        std::optional<ktxLevelIndexEntry>::optional((optional<ktxLevelIndexEntry> *)0x15917e);
        local_888 = local_888 + 4;
      } while (local_888 != &local_528);
      local_570 = 0;
      while( true ) {
        uVar1 = local_570;
        sVar5 = std::array<ktx::InputStream,_2UL>::size(local_4d0);
        if (sVar5 <= uVar1) break;
        if (local_51c.uint_value < local_508[local_570 - 1]) {
          pvVar6 = std::array<ktx::InputStream,_2UL>::operator[]
                             (in_stack_fffffffffffff6a0,(size_type)in_stack_fffffffffffff698);
          __buf = local_528;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffff6b0,(char *)in_stack_fffffffffffff6a8);
          in_stack_fffffffffffff698 = local_598;
          in_stack_fffffffffffff6a0 = local_590;
          read(in_RDI,(int)pvVar6,__buf,(size_t)local_588);
          pvVar7 = local_588;
          std::optional<ktxLevelIndexEntry>::operator=
                    ((optional<ktxLevelIndexEntry> *)in_stack_fffffffffffff6b0,
                     in_stack_fffffffffffff6a8);
        }
        local_570 = local_570 + 1;
      }
      local_2c8 = local_628;
      local_2d0 = "Level{}.byteOffset";
      local_220 = "Level{}.byteOffset";
      local_628[0] = (v10 *)0x38641a;
      local_218 = local_2c8;
      local_2f8 = std::char_traits<char>::length((char_type *)0x15937d);
      local_28 = local_2d0;
      local_2e8 = local_628[0];
      local_2f0 = &local_51c;
      local_f0 = &local_2e8;
      local_300 = local_628[0];
      sStack_2e0 = local_2f8;
      local_2d8 = local_618;
      local_e8 = local_300;
      sStack_e0 = local_2f8;
      local_328[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                                 *)&local_2f0->string,pvVar7,(uint *)local_618);
      local_208 = &local_310;
      local_210 = local_328;
      local_1f8 = 2;
      local_310 = 2;
      pvVar7 = local_300;
      local_200 = local_210;
      local_1f0 = local_208;
      local_1e8 = local_210;
      local_308 = local_210;
      ::fmt::v10::vformat_abi_cxx11_(fmt,in_stack_fffffffffffff908);
      auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_618);
      local_2a8 = local_668;
      local_2b0 = "/index/levels/{}/byteOffset";
      local_240 = "/index/levels/{}/byteOffset";
      local_668[0] = "/index/levels/{}/byteOffset";
      local_238 = local_2a8;
      local_5f8 = auVar8;
      local_350 = std::char_traits<char>::length((char_type *)0x159574);
      local_18 = local_2b0;
      local_330 = local_658;
      local_340 = local_668[0];
      local_348 = &local_51c;
      local_d0 = &local_340;
      local_358 = local_668[0];
      sStack_338 = local_350;
      local_c8 = local_358;
      sStack_c0 = local_350;
      local_378[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                                 *)&local_348->string,pvVar7,(uint *)local_330);
      local_1d8 = &local_368;
      local_1e0 = local_378;
      local_1c8 = 2;
      local_368 = 2;
      local_1d0 = local_1e0;
      local_1c0 = local_1d8;
      local_1b8 = local_1e0;
      local_360 = local_1e0;
      ::fmt::v10::vformat_abi_cxx11_(fmt,in_stack_fffffffffffff908);
      auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_658);
      local_638 = auVar8;
      bVar2 = std::optional<ktxLevelIndexEntry>::has_value((optional<ktxLevelIndexEntry> *)0x159739)
      ;
      if (bVar2) {
        std::optional<ktxLevelIndexEntry>::operator->((optional<ktxLevelIndexEntry> *)0x15974c);
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)in_stack_fffffffffffff6a0,
                   (unsigned_long *)in_stack_fffffffffffff698);
      }
      else {
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x15976b);
      }
      bVar2 = std::optional<ktxLevelIndexEntry>::has_value((optional<ktxLevelIndexEntry> *)0x15977c)
      ;
      if (bVar2) {
        std::optional<ktxLevelIndexEntry>::operator->((optional<ktxLevelIndexEntry> *)0x159793);
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)in_stack_fffffffffffff6a0,
                   (unsigned_long *)in_stack_fffffffffffff698);
      }
      else {
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x1597b2);
      }
      puVar9 = local_688;
      textHeaderIn._M_str = in_stack_fffffffffffff6f0;
      textHeaderIn._M_len = (size_t)in_stack_fffffffffffff6e8;
      jsonPathIn._M_str = (char *)in_stack_fffffffffffff6e0;
      jsonPathIn._M_len = (size_t)in_stack_fffffffffffff6d8;
      DiffHex<unsigned_long>::DiffHex
                ((DiffHex<unsigned_long> *)in_stack_fffffffffffff6d0,textHeaderIn,jsonPathIn,
                 (optional<unsigned_long> *)in_stack_fffffffffffff6c8,
                 (optional<unsigned_long> *)in_stack_fffffffffffff700);
      pvVar7 = local_5e8;
      PrintDiff::operator<<(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      std::__cxx11::string::~string(local_658);
      std::__cxx11::string::~string(local_618);
      local_2b8 = local_718;
      local_2c0 = "Level{}.byteLength";
      local_230 = "Level{}.byteLength";
      local_718[0] = (v10 *)0x386449;
      in_stack_fffffffffffff6f0 = local_4c8;
      local_228 = local_2b8;
      local_3a0 = std::char_traits<char>::length((char_type *)0x159899);
      local_30 = local_2c0;
      in_stack_fffffffffffff700 = local_708;
      local_390 = local_718[0];
      local_398 = &local_51c;
      local_b0 = &local_390;
      local_3a8 = local_718[0];
      sStack_388 = local_3a0;
      local_380 = in_stack_fffffffffffff700;
      local_a8 = local_3a8;
      sStack_a0 = local_3a0;
      local_3c8[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                                 *)&local_398->string,pvVar7,(uint *)in_stack_fffffffffffff700);
      local_1a8 = &local_3b8;
      local_1b0 = local_3c8;
      local_198 = 2;
      local_3b8 = 2;
      pvVar7 = local_3a8;
      local_1a0 = local_1b0;
      local_190 = local_1a8;
      local_188 = local_1b0;
      local_3b0 = local_1b0;
      ::fmt::v10::vformat_abi_cxx11_(fmt,in_stack_fffffffffffff908);
      fmt = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff700);
      local_298 = local_758;
      local_2a0 = "/index/levels/{}/byteLength";
      local_250 = "/index/levels/{}/byteLength";
      local_758[0] = "/index/levels/{}/byteLength";
      local_248 = local_298;
      local_3f0 = std::char_traits<char>::length((char_type *)0x159a81);
      local_20 = local_2a0;
      local_3d0 = local_748;
      local_3e0 = local_758[0];
      local_3e8 = &local_51c;
      local_90 = &local_3e0;
      local_3f8 = local_758[0];
      sStack_3d8 = local_3f0;
      local_88 = local_3f8;
      sStack_80 = local_3f0;
      in_stack_fffffffffffff6e8 =
           ::fmt::v10::
           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                     ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                       *)&local_3e8->string,pvVar7,(uint *)local_3d0);
      local_178 = &local_408;
      local_180 = local_418;
      local_168 = 2;
      local_408 = 2;
      in_stack_fffffffffffff6e0 = extraout_RDX;
      local_418[0] = in_stack_fffffffffffff6e8;
      local_170 = local_180;
      local_160 = local_178;
      local_158 = local_180;
      local_400 = local_180;
      ::fmt::v10::vformat_abi_cxx11_(fmt,in_stack_fffffffffffff908);
      auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_748);
      local_728 = auVar8;
      bVar2 = std::optional<ktxLevelIndexEntry>::has_value((optional<ktxLevelIndexEntry> *)0x159c31)
      ;
      if (bVar2) {
        std::optional<ktxLevelIndexEntry>::operator->((optional<ktxLevelIndexEntry> *)0x159c44);
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)in_stack_fffffffffffff6a0,puVar9);
      }
      else {
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x159c67);
      }
      bVar2 = std::optional<ktxLevelIndexEntry>::has_value((optional<ktxLevelIndexEntry> *)0x159c78)
      ;
      if (bVar2) {
        std::optional<ktxLevelIndexEntry>::operator->((optional<ktxLevelIndexEntry> *)0x159c8f);
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)in_stack_fffffffffffff6a0,puVar9);
      }
      else {
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x159cb2);
      }
      puVar9 = local_778;
      textHeaderIn_00._M_str = in_stack_fffffffffffff6f0;
      textHeaderIn_00._M_len = (size_t)in_stack_fffffffffffff6e8;
      jsonPathIn_00._M_str = (char *)in_stack_fffffffffffff6e0;
      jsonPathIn_00._M_len = (size_t)in_stack_fffffffffffff6d8;
      Diff<unsigned_long>::Diff
                ((Diff<unsigned_long> *)in_stack_fffffffffffff6d0,textHeaderIn_00,jsonPathIn_00,
                 (optional<unsigned_long> *)in_stack_fffffffffffff6c8,
                 (optional<unsigned_long> *)in_stack_fffffffffffff700);
      pvVar7 = local_6d8;
      PrintDiff::operator<<(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      std::__cxx11::string::~string(local_748);
      std::__cxx11::string::~string(local_708);
      local_288 = local_808;
      local_290 = "Level{}.uncompressedByteLength";
      local_260 = "Level{}.uncompressedByteLength";
      local_808[0] = (v10 *)0x386478;
      local_258 = local_288;
      local_440 = std::char_traits<char>::length((char_type *)0x159d96);
      local_10 = local_290;
      in_stack_fffffffffffff6c8 = local_7f8;
      local_430 = local_808[0];
      local_438 = &local_51c;
      local_70 = &local_430;
      local_448 = local_808[0];
      sStack_428 = local_440;
      local_420 = in_stack_fffffffffffff6c8;
      local_68 = local_448;
      sStack_60 = local_440;
      local_468[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                                 *)&local_438->string,pvVar7,(uint *)in_stack_fffffffffffff6c8);
      local_148 = &local_458;
      local_150 = local_468;
      local_138 = 2;
      local_458 = 2;
      pvVar7 = local_448;
      local_140 = local_150;
      local_130 = local_148;
      local_128 = local_150;
      local_450 = local_150;
      ::fmt::v10::vformat_abi_cxx11_(fmt,in_stack_fffffffffffff908);
      auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff6c8);
      local_278 = &local_848;
      local_280 = "/index/levels/{}/uncompressedByteLength";
      local_270 = "/index/levels/{}/uncompressedByteLength";
      local_848 = "/index/levels/{}/uncompressedByteLength";
      in_stack_fffffffffffff6d0 = (allocator<char> *)&local_840;
      local_268 = local_278;
      local_7d8 = auVar8;
      in_stack_fffffffffffff6d8 = (char *)std::char_traits<char>::length((char_type *)0x159f7e);
      *(char **)in_stack_fffffffffffff6d0 = in_stack_fffffffffffff6d8;
      local_8 = local_280;
      local_470 = local_838;
      local_480 = local_848;
      uStack_478 = local_840;
      local_488 = &local_51c;
      local_50 = &local_480;
      local_498 = local_848;
      local_48 = local_498;
      in_stack_fffffffffffff6b0 =
           (basic_string_view<char,_std::char_traits<char>_> *)
           ::fmt::v10::
           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                     ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                       *)&local_488->string,pvVar7,(uint *)local_470);
      local_118 = &local_4a8;
      local_120 = local_4b8;
      local_108 = 2;
      local_4a8 = 2;
      in_stack_fffffffffffff6a8 = extraout_RDX_00;
      local_4b8[0] = in_stack_fffffffffffff6b0;
      local_110 = local_120;
      local_100 = local_118;
      local_f8 = local_120;
      local_4a0 = local_120;
      ::fmt::v10::vformat_abi_cxx11_(fmt,in_stack_fffffffffffff908);
      auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_838);
      local_818 = auVar8;
      bVar2 = std::optional<ktxLevelIndexEntry>::has_value((optional<ktxLevelIndexEntry> *)0x15a12e)
      ;
      if (bVar2) {
        std::optional<ktxLevelIndexEntry>::operator->((optional<ktxLevelIndexEntry> *)0x15a141);
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)in_stack_fffffffffffff6a0,puVar9);
      }
      else {
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x15a164);
      }
      bVar2 = std::optional<ktxLevelIndexEntry>::has_value((optional<ktxLevelIndexEntry> *)0x15a175)
      ;
      if (bVar2) {
        std::optional<ktxLevelIndexEntry>::operator->((optional<ktxLevelIndexEntry> *)0x15a18c);
        std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                  ((optional<unsigned_long> *)in_stack_fffffffffffff6a0,puVar9);
      }
      else {
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)0x15a1af);
      }
      in_stack_fffffffffffff698 = (string *)&stack0xfffffffffffff798;
      textHeaderIn_01._M_str = in_stack_fffffffffffff6f0;
      textHeaderIn_01._M_len = (size_t)in_stack_fffffffffffff6e8;
      jsonPathIn_01._M_str = (char *)in_stack_fffffffffffff6e0;
      jsonPathIn_01._M_len = (size_t)in_stack_fffffffffffff6d8;
      Diff<unsigned_long>::Diff
                ((Diff<unsigned_long> *)in_stack_fffffffffffff6d0,textHeaderIn_01,jsonPathIn_01,
                 (optional<unsigned_long> *)in_stack_fffffffffffff6c8,
                 (optional<unsigned_long> *)in_stack_fffffffffffff700);
      pvVar7 = local_7c8;
      PrintDiff::operator<<(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
      std::__cxx11::string::~string(local_838);
      std::__cxx11::string::~string(local_7f8);
    }
  }
  return;
}

Assistant:

void CommandCompare::compareLevelIndex(PrintDiff& diff, InputStreams& streams) {
    if (options.ignoreIndex != IgnoreIndex::none) return;

    diff.setContext("Level Index\n\n");

    const uint32_t numLevels[] = {
        std::max(1u, headers[0].levelCount),
        std::max(1u, headers[1].levelCount)
    };
    const uint32_t maxNumLevels = std::max(numLevels[0], numLevels[1]);

    for (uint32_t level = 0; level < maxNumLevels; ++level) {
        const auto levelIndexEntryOffset = sizeof(KTX_header2) + level * sizeof(ktxLevelIndexEntry);
        std::optional<ktxLevelIndexEntry> levelIndexEntry[2];
        for (std::size_t i = 0; i < streams.size(); ++i)
            if (level < numLevels[i]) {
                ktxLevelIndexEntry entry;
                read(streams[i], levelIndexEntryOffset, &entry, sizeof(entry), "the level index");
                levelIndexEntry[i] = entry;
            }

        diff << DiffHex(fmt::format("Level{}.byteOffset", level),
            fmt::format("/index/levels/{}/byteOffset", level),
            OPT_FIELDS(levelIndexEntry, byteOffset));
        diff << Diff(fmt::format("Level{}.byteLength", level),
            fmt::format("/index/levels/{}/byteLength", level),
            OPT_FIELDS(levelIndexEntry, byteLength));
        diff << Diff(fmt::format("Level{}.uncompressedByteLength", level),
            fmt::format("/index/levels/{}/uncompressedByteLength", level),
            OPT_FIELDS(levelIndexEntry, uncompressedByteLength));
    }
}